

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerConnection.cxx
# Opt level: O0

void __thiscall cmStdIoConnection::SetServer(cmStdIoConnection *this,cmServerBase *s)

{
  undefined1 local_38 [32];
  cmServerBase *local_18;
  cmServerBase *s_local;
  cmStdIoConnection *this_local;
  
  local_18 = s;
  s_local = (cmServerBase *)this;
  cmConnection::SetServer((cmConnection *)this,s);
  if (local_18 != (cmServerBase *)0x0) {
    SetupStream((cmStdIoConnection *)(local_38 + 0x10),(int)this);
    ::cm::uv_handle_ptr_<uv_stream_s>::operator=
              (&this->ReadStream,(uv_handle_ptr_<uv_stream_s> *)(local_38 + 0x10));
    ::cm::uv_handle_ptr_<uv_stream_s>::~uv_handle_ptr_
              ((uv_handle_ptr_<uv_stream_s> *)(local_38 + 0x10));
    SetupStream((cmStdIoConnection *)local_38,(int)this);
    ::cm::uv_handle_ptr_<uv_stream_s>::operator=
              (&(this->super_cmEventBasedConnection).WriteStream,
               (uv_handle_ptr_<uv_stream_s> *)local_38);
    ::cm::uv_handle_ptr_<uv_stream_s>::~uv_handle_ptr_((uv_handle_ptr_<uv_stream_s> *)local_38);
  }
  return;
}

Assistant:

void cmStdIoConnection::SetServer(cmServerBase* s)
{
  cmConnection::SetServer(s);
  if (!s) {
    return;
  }

  this->ReadStream = SetupStream(0);
  this->WriteStream = SetupStream(1);
}